

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

size_t __thiscall clickhouse::BufferedInput::DoNext(BufferedInput *this,void **ptr,size_t len)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((this->array_input_).len_ == 0) {
    puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = (*this->slave_->_vptr_InputStream[2])
                      (this->slave_,puVar1,
                       (long)(this->buffer_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    (this->array_input_).data_ = puVar1;
    (this->array_input_).len_ = CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*(this->array_input_).super_ZeroCopyInput.super_InputStream._vptr_InputStream[3])
                    (&this->array_input_,ptr,len);
  return CONCAT44(extraout_var_00,iVar2);
}

Assistant:

size_t BufferedInput::DoNext(const void** ptr, size_t len)  {
    if (array_input_.Exhausted()) {
        array_input_.Reset(
            buffer_.data(), slave_->Read(buffer_.data(), buffer_.size())
        );
    }

    return array_input_.Next(ptr, len);
}